

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  ImVec2 *p1;
  int in_ESI;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  undefined8 in_stack_ffffffffffffff80;
  ImU32 col_00;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 in_stack_ffffffffffffffa0;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28 [3];
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  p1 = (ImVec2 *)(ulong)(in_ESI + 1);
  col_00 = (ImU32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_8 = in_XMM0_Da;
  fStack_4 = in_XMM0_Db;
  local_10 = in_XMM1_Da;
  fStack_c = in_XMM1_Db;
  switch(p1) {
  case (ImVec2 *)0x0:
  case (ImVec2 *)0x5:
    break;
  case (ImVec2 *)0x1:
    ImVec2::ImVec2(local_28,in_XMM0_Da + in_XMM1_Da,in_XMM0_Db - in_XMM1_Db);
    ImVec2::ImVec2(&local_30,local_8 + local_10,fStack_4 + fStack_c);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_RDI,in_stack_ffffffffffffff88,col_00);
    break;
  case (ImVec2 *)0x2:
    ImVec2::ImVec2(&local_38,in_XMM0_Da - in_XMM1_Da,in_XMM0_Db + in_XMM1_Db);
    ImVec2::ImVec2(&local_40,local_8 - local_10,fStack_4 - fStack_c);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_stack_ffffffffffffff90,in_RDI,col_00);
    break;
  case (ImVec2 *)0x3:
    ImVec2::ImVec2(&local_48,in_XMM0_Da + in_XMM1_Da,in_XMM0_Db + in_XMM1_Db);
    ImVec2::ImVec2(&local_50,local_8 - local_10,fStack_4 + fStack_c);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,(ImU32)((ulong)in_RDI >> 0x20));
    break;
  case (ImVec2 *)0x4:
    ImVec2::ImVec2(&local_58,in_XMM0_Da - in_XMM1_Da,in_XMM0_Db - in_XMM1_Db);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,local_8 + local_10,fStack_4 - fStack_c);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,col_00);
  }
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}